

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_Interval __thiscall
ON_PlaneEquation::ValueRange
          (ON_PlaneEquation *this,size_t point_index_count,size_t point_index_stride,
          uint *point_index_list,ON_3dPointListRef *point_list)

{
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  bool bVar1;
  ON_Interval OVar2;
  uint local_e0;
  uint local_dc;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  uint local_9c;
  undefined1 auStack_98 [4];
  uint i_1;
  double local_90;
  double local_88;
  uint local_7c;
  undefined1 auStack_78 [4];
  uint j_local;
  double local_70;
  double local_68;
  uint local_5c;
  uint local_58;
  uint j;
  uint i;
  uint point_stride;
  uint point_count;
  uint vertex_count;
  double h;
  ON_3dPointListRef *point_list_local;
  uint *point_index_list_local;
  size_t point_index_stride_local;
  size_t point_index_count_local;
  ON_PlaneEquation *this_local;
  ON_Interval value_interval;
  
  this_local = (ON_PlaneEquation *)ON_Interval::EmptyInterval.m_t[0];
  value_interval.m_t[0] = ON_Interval::EmptyInterval.m_t[1];
  h = (double)point_list;
  point_list_local = (ON_3dPointListRef *)point_index_list;
  point_index_list_local = (uint *)point_index_stride;
  point_index_stride_local = point_index_count;
  point_index_count_local = (size_t)this;
  bVar1 = IsValid(this);
  if ((bVar1) &&
     (point_stride = ON_3dPointListRef::PointCount((ON_3dPointListRef *)h), point_stride != 0)) {
    if ((point_index_stride_local == 0) || (0xfffffffe < point_index_stride_local)) {
      local_dc = 0;
    }
    else {
      local_dc = (uint)point_index_stride_local;
    }
    i = local_dc;
    if (local_dc != 0) {
      if (point_list_local == (ON_3dPointListRef *)0x0) {
        if (local_dc <= point_stride) {
          for (local_9c = 0; local_9c < i; local_9c = local_9c + 1) {
            ON_3dPointListRef::operator[](&local_b8,(ON_3dPointListRef *)h,local_9c);
            P_01.y = local_b8.y;
            P_01.x = local_b8.x;
            P_01.z = local_b8.z;
            _point_count = (ON_PlaneEquation *)ValueAt(this,P_01);
            bVar1 = ON_IsValid((double)_point_count);
            if (bVar1) {
              ON_Interval::Set((ON_Interval *)&this_local,(double)_point_count,(double)_point_count)
              ;
              while (local_9c = local_9c + 1, local_9c < i) {
                ON_3dPointListRef::operator[](&local_d0,(ON_3dPointListRef *)h,local_9c);
                P_02.y = local_d0.y;
                P_02.x = local_d0.x;
                P_02.z = local_d0.z;
                _point_count = (ON_PlaneEquation *)ValueAt(this,P_02);
                bVar1 = ON_IsValid((double)_point_count);
                if (bVar1) {
                  if ((double)this_local <= (double)_point_count) {
                    if (value_interval.m_t[0] < (double)_point_count) {
                      value_interval.m_t[0] = (double)_point_count;
                    }
                  }
                  else {
                    this_local = _point_count;
                  }
                }
              }
              break;
            }
          }
        }
      }
      else {
        if ((point_index_list_local == (uint *)0x0) || ((uint *)0xfffffffe < point_index_list_local)
           ) {
          local_e0 = 0;
        }
        else {
          local_e0 = (uint)point_index_list_local;
        }
        j = local_e0;
        if (local_e0 != 0) {
          for (local_58 = 0; local_58 < i * j; local_58 = j + local_58) {
            local_5c = (&point_list_local->m_point_count)[local_58];
            if (local_5c < point_stride) {
              ON_3dPointListRef::operator[]
                        ((ON_3dPoint *)auStack_78,(ON_3dPointListRef *)h,local_5c);
              P.y = local_70;
              P.x = _auStack_78;
              P.z = local_68;
              _point_count = (ON_PlaneEquation *)ValueAt(this,P);
              bVar1 = ON_IsValid((double)_point_count);
              if (bVar1) {
                ON_Interval::Set((ON_Interval *)&this_local,(double)_point_count,
                                 (double)_point_count);
                for (local_58 = local_58 + 1; local_58 < i * j; local_58 = j + local_58) {
                  local_7c = (&point_list_local->m_point_count)[local_58];
                  if (local_7c < point_stride) {
                    ON_3dPointListRef::operator[]
                              ((ON_3dPoint *)auStack_98,(ON_3dPointListRef *)h,local_7c);
                    P_00.y = local_90;
                    P_00.x = _auStack_98;
                    P_00.z = local_88;
                    _point_count = (ON_PlaneEquation *)ValueAt(this,P_00);
                    bVar1 = ON_IsValid((double)_point_count);
                    if (bVar1) {
                      if ((double)this_local <= (double)_point_count) {
                        if (value_interval.m_t[0] < (double)_point_count) {
                          value_interval.m_t[0] = (double)_point_count;
                        }
                      }
                      else {
                        this_local = _point_count;
                      }
                    }
                  }
                }
                break;
              }
            }
          }
        }
      }
    }
  }
  OVar2.m_t[0] = (double)this_local;
  OVar2.m_t[1] = value_interval.m_t[0];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_index_count,
  size_t point_index_stride,
  const unsigned int* point_index_list,
  const class ON_3dPointListRef& point_list
  ) const
{
  ON_Interval value_interval(ON_Interval::EmptyInterval);

  for(;;)
  {
    if ( false == IsValid() )
      break; // invalid plane equation;

    double h;
    const unsigned int vertex_count = point_list.PointCount();
    if ( 0 == vertex_count )
      break;
    const unsigned int point_count = (point_index_count > 0 && point_index_count < (size_t)ON_UNSET_UINT_INDEX)
                                   ? ((unsigned int)point_index_count)
                                   : 0;
    if ( 0 == point_count )
      break;

    if ( 0 != point_index_list )
    {
      const unsigned int point_stride = (point_index_stride > 0 && point_index_stride < (size_t)ON_UNSET_UINT_INDEX)
                                      ? ((unsigned int)point_index_stride)
                                      : 0;
      if ( 0 == point_stride )
        break;
      for ( unsigned int i = 0; i < point_count*point_stride; i += point_stride )
      {
        unsigned int j = point_index_list[i];
        if ( j >= vertex_count )
          continue;
        h = ValueAt(point_list[j]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count*point_stride; i+= point_stride )
          {
            unsigned int j_local = point_index_list[i];
            if ( j_local >= vertex_count )
              continue;
            h = ValueAt(point_list[j_local]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }
    else if ( point_count <= vertex_count )
    {
      for ( unsigned int i = 0; i < point_count; i++ )
      {        
        h = ValueAt(point_list[i]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count; i++ )
          {
            h = ValueAt(point_list[i]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }

    break;
  }
  return value_interval;
}